

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O1

void __thiscall SPTest_VarStages_Test::TestBody(SPTest_VarStages_Test *this)

{
  bool bVar1;
  SuffixHandler<int> SVar2;
  int i;
  long lVar3;
  char *pcVar4;
  StringRef name;
  AssertionResult gtest_ar;
  SPAdapter sp;
  TestBasicProblem p;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_648;
  AssertHelper local_640;
  internal local_638 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_630;
  SPAdapter local_628;
  ColProblem local_3e0;
  
  TestBasicProblem::TestBasicProblem((TestBasicProblem *)&local_3e0,6,0);
  name.size_ = 5;
  name.data_ = "stage";
  SVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddSuffix<int>
                    (&local_3e0.super_Problem,name,0);
  **(undefined4 **)((long)SVar2.suffix_.super_BasicSuffix<int>.super_SuffixBase.impl_ + 0x18) = 3;
  *(undefined4 *)
   (*(long *)((long)SVar2.suffix_.super_BasicSuffix<int>.super_SuffixBase.impl_ + 0x18) + 4) = 2;
  *(undefined4 *)
   (*(long *)((long)SVar2.suffix_.super_BasicSuffix<int>.super_SuffixBase.impl_ + 0x18) + 8) = 3;
  mp::SPAdapter::SPAdapter(&local_628,&local_3e0);
  local_648.ptr_._0_4_ = 6;
  local_640.data_._0_4_ =
       (int)((ulong)((long)local_628.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_628.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  testing::internal::CmpHelperEQ<int,int>
            (local_638,"6","sp.num_vars()",(int *)&local_648,(int *)&local_640);
  if (local_638[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_648);
    if (local_630.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_630.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x148,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_640,(Message *)&local_648);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    if (local_648.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_648.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_648.ptr_ + 8))();
      }
      local_648.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_630,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_648.ptr_ = local_648.ptr_ & 0xffffffff00000000;
  local_640.data_._0_4_ =
       (int)((ulong)((long)((local_628.problem_)->super_Problem).algebraic_cons_.
                           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)((local_628.problem_)->super_Problem).algebraic_cons_.
                          super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0xf0f0f0f;
  testing::internal::CmpHelperEQ<int,int>
            (local_638,"0","sp.num_cons()",(int *)&local_648,(int *)&local_640);
  if (local_638[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_648);
    if (local_630.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_630.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x149,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_640,(Message *)&local_648);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    if (local_648.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_648.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_648.ptr_ + 8))();
      }
      local_648.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_630,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_648.ptr_._0_4_ = 3;
  local_640.data_._0_4_ = local_628.num_stages_;
  testing::internal::CmpHelperEQ<int,int>
            (local_638,"3","sp.num_stages()",(int *)&local_648,(int *)&local_640);
  if (local_638[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_648);
    if (local_630.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_630.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x14a,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_640,(Message *)&local_648);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    if (local_648.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_648.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_648.ptr_ + 8))();
      }
      local_648.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_630,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_648.ptr_._0_4_ = 3;
  local_640.data_._0_4_ =
       *local_628.num_stage_vars_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start;
  testing::internal::CmpHelperEQ<int,int>
            (local_638,"3","sp.stage(0).num_vars()",(int *)&local_648,(int *)&local_640);
  if (local_638[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_648);
    if (local_630.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_630.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x14b,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_640,(Message *)&local_648);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    if (local_648.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_648.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_648.ptr_ + 8))();
      }
      local_648.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_630,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_648.ptr_._0_4_ = 1;
  local_640.data_._0_4_ =
       local_628.num_stage_vars_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  testing::internal::CmpHelperEQ<int,int>
            (local_638,"1","sp.stage(1).num_vars()",(int *)&local_648,(int *)&local_640);
  if (local_638[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_648);
    if (local_630.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_630.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x14c,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_640,(Message *)&local_648);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    if (local_648.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_648.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_648.ptr_ + 8))();
      }
      local_648.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_630,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_648.ptr_._0_4_ = 2;
  local_640.data_._0_4_ =
       local_628.num_stage_vars_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[2];
  testing::internal::CmpHelperEQ<int,int>
            (local_638,"2","sp.stage(2).num_vars()",(int *)&local_648,(int *)&local_640);
  if (local_638[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_648);
    if (local_630.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_630.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x14d,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_640,(Message *)&local_648);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    if (local_648.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_648.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_648.ptr_ + 8))();
      }
      local_648.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_630,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar3 = 0;
  do {
    local_648.ptr_ = local_648.ptr_ & 0xffffffff00000000;
    local_640.data_._0_4_ =
         local_628.num_stage_cons_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar3];
    testing::internal::CmpHelperEQ<int,int>
              (local_638,"0","sp.stage(i).num_cons()",(int *)&local_648,(int *)&local_640);
    if (local_638[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_648);
      pcVar4 = "";
      if (local_630.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar4 = ((local_630.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_640,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x14f
                 ,pcVar4);
      testing::internal::AssertHelper::operator=(&local_640,(Message *)&local_648);
      testing::internal::AssertHelper::~AssertHelper(&local_640);
      if (local_648.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_648.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_648.ptr_ + 8))();
        }
        local_648.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_630,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  mp::SPAdapter::~SPAdapter(&local_628);
  local_3e0.super_Problem.super_ExprFactory._vptr_BasicExprFactory =
       (_func_int **)&PTR__ColProblem_00199678;
  local_3e0.super_Problem.super_SuffixManager._vptr_SuffixManager =
       (_func_int **)&PTR__ColProblem_00199698;
  if (local_3e0.coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e0.coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e0.coefs_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e0.coefs_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3e0.row_indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e0.row_indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e0.row_indices_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e0.row_indices_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3e0.col_starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e0.col_starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e0.col_starts_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e0.col_starts_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_3e0.super_Problem);
  return;
}

Assistant:

TEST(SPTest, VarStages) {
  TestBasicProblem p(6);
  auto stage = p.AddIntSuffix("stage", mp::suf::VAR, 3);
  stage.SetValue(0, 3);
  stage.SetValue(1, 2);
  stage.SetValue(2, 3);
  mp::SPAdapter sp(p);
  EXPECT_EQ(6, sp.num_vars());
  EXPECT_EQ(0, sp.num_cons());
  EXPECT_EQ(3, sp.num_stages());
  EXPECT_EQ(3, sp.stage(0).num_vars());
  EXPECT_EQ(1, sp.stage(1).num_vars());
  EXPECT_EQ(2, sp.stage(2).num_vars());
  for (int i = 0; i < 3; ++i)
    EXPECT_EQ(0, sp.stage(i).num_cons());
}